

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gears.c
# Opt level: O2

void gear(GLfloat inner_radius,GLfloat outer_radius,GLfloat width,GLint teeth,GLfloat tooth_depth)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  int iVar7;
  int iVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  
  fVar9 = outer_radius + -0.35;
  fVar10 = (float)teeth;
  fVar17 = (6.2831855 / fVar10) * 0.25;
  glShadeModel(0x1d00);
  glNormal3f(0,0,0x3f800000);
  glBegin(8);
  fVar11 = width * 0.5;
  fVar12 = fVar17 * 3.0;
  for (iVar7 = 0; iVar7 <= teeth; iVar7 = iVar7 + 1) {
    fVar13 = (((float)iVar7 + (float)iVar7) * 3.1415927) / fVar10;
    dVar1 = (double)fVar13;
    dVar2 = cos(dVar1);
    dVar3 = sin(dVar1);
    glVertex3f((float)dVar2 * inner_radius,(float)dVar3 * inner_radius,fVar11);
    dVar2 = cos(dVar1);
    dVar3 = sin(dVar1);
    glVertex3f((float)dVar2 * fVar9,(float)dVar3 * fVar9,fVar11);
    if (iVar7 < teeth) {
      dVar2 = cos(dVar1);
      dVar1 = sin(dVar1);
      glVertex3f((float)dVar2 * inner_radius,(float)dVar1 * inner_radius,fVar11);
      dVar1 = (double)(fVar13 + fVar12);
      dVar2 = cos(dVar1);
      dVar1 = sin(dVar1);
      glVertex3f((float)dVar2 * fVar9,(float)dVar1 * fVar9,fVar11);
    }
  }
  fVar13 = outer_radius + 0.35;
  glEnd();
  glBegin(7);
  iVar8 = 0;
  iVar7 = 0;
  if (0 < teeth) {
    iVar7 = teeth;
  }
  fVar14 = fVar17 + fVar17;
  for (; iVar7 != iVar8; iVar8 = iVar8 + 1) {
    fVar15 = (((float)iVar8 + (float)iVar8) * 3.1415927) / fVar10;
    dVar1 = cos((double)fVar15);
    dVar2 = sin((double)fVar15);
    glVertex3f((float)dVar1 * fVar9,(float)dVar2 * fVar9,fVar11);
    dVar1 = cos((double)(fVar17 + fVar15));
    dVar2 = sin((double)(fVar17 + fVar15));
    glVertex3f((float)dVar1 * fVar13,(float)dVar2 * fVar13,fVar11);
    dVar1 = cos((double)(fVar14 + fVar15));
    dVar2 = sin((double)(fVar14 + fVar15));
    glVertex3f((float)dVar1 * fVar13,(float)dVar2 * fVar13,fVar11);
    dVar1 = cos((double)(fVar15 + fVar12));
    dVar2 = sin((double)(fVar15 + fVar12));
    glVertex3f((float)dVar1 * fVar9,(float)dVar2 * fVar9,fVar11);
  }
  glEnd();
  glNormal3f(0,0);
  glBegin(8);
  fVar15 = width * -0.5;
  for (iVar8 = 0; iVar8 <= teeth; iVar8 = iVar8 + 1) {
    fVar16 = (((float)iVar8 + (float)iVar8) * 3.1415927) / fVar10;
    dVar1 = (double)fVar16;
    dVar2 = cos(dVar1);
    dVar3 = sin(dVar1);
    glVertex3f((float)dVar2 * fVar9,(float)dVar3 * fVar9,fVar15);
    dVar2 = cos(dVar1);
    dVar3 = sin(dVar1);
    glVertex3f((float)dVar2 * inner_radius,(float)dVar3 * inner_radius);
    if (iVar8 < teeth) {
      dVar2 = (double)(fVar16 + fVar12);
      dVar3 = cos(dVar2);
      dVar2 = sin(dVar2);
      glVertex3f((float)dVar3 * fVar9,(float)dVar2 * fVar9,fVar15);
      dVar2 = cos(dVar1);
      dVar1 = sin(dVar1);
      glVertex3f((float)dVar2 * inner_radius,(float)dVar1 * inner_radius);
    }
  }
  glEnd();
  glBegin(7);
  for (iVar8 = 0; iVar7 != iVar8; iVar8 = iVar8 + 1) {
    fVar16 = (((float)iVar8 + (float)iVar8) * 3.1415927) / fVar10;
    dVar1 = cos((double)(fVar12 + fVar16));
    dVar2 = sin((double)(fVar12 + fVar16));
    glVertex3f((float)dVar1 * fVar9,(float)dVar2 * fVar9,fVar15);
    dVar1 = cos((double)(fVar14 + fVar16));
    dVar2 = sin((double)(fVar14 + fVar16));
    glVertex3f((float)dVar1 * fVar13,(float)dVar2 * fVar13,fVar15);
    dVar1 = cos((double)(fVar17 + fVar16));
    dVar2 = sin((double)(fVar17 + fVar16));
    glVertex3f((float)dVar1 * fVar13,(float)dVar2 * fVar13,fVar15);
    dVar1 = cos((double)fVar16);
    dVar2 = sin((double)fVar16);
    glVertex3f((float)dVar1 * fVar9,(float)dVar2 * fVar9);
  }
  glEnd();
  glBegin(8);
  for (iVar8 = 0; iVar7 != iVar8; iVar8 = iVar8 + 1) {
    fVar16 = (((float)iVar8 + (float)iVar8) * 3.1415927) / fVar10;
    dVar1 = (double)fVar16;
    dVar2 = cos(dVar1);
    dVar3 = sin(dVar1);
    glVertex3f((float)dVar2 * fVar9,(float)dVar3 * fVar9,fVar11);
    dVar2 = cos(dVar1);
    dVar3 = sin(dVar1);
    glVertex3f((float)dVar2 * fVar9,(float)dVar3 * fVar9,fVar15);
    dVar2 = (double)(fVar17 + fVar16);
    dVar3 = cos(dVar2);
    dVar4 = cos(dVar1);
    fVar18 = (float)dVar3 * fVar13 + (float)dVar4 * -fVar9;
    dVar3 = sin(dVar2);
    dVar4 = sin(dVar1);
    fVar19 = (float)dVar3 * fVar13 + (float)dVar4 * -fVar9;
    fVar20 = SQRT(fVar18 * fVar18 + fVar19 * fVar19);
    glNormal3f(fVar19 / fVar20,-fVar18 / fVar20,0);
    dVar3 = cos(dVar2);
    dVar4 = sin(dVar2);
    glVertex3f((float)dVar3 * fVar13,(float)dVar4 * fVar13,fVar11);
    dVar3 = cos(dVar2);
    dVar2 = sin(dVar2);
    glVertex3f((float)dVar3 * fVar13,(float)dVar2 * fVar13,fVar15);
    dVar2 = cos(dVar1);
    dVar3 = sin(dVar1);
    glNormal3f((float)dVar2,(float)dVar3,0);
    dVar2 = (double)(fVar14 + fVar16);
    dVar3 = cos(dVar2);
    dVar4 = sin(dVar2);
    glVertex3f((float)dVar3 * fVar13,(float)dVar4 * fVar13,fVar11);
    dVar3 = cos(dVar2);
    dVar4 = sin(dVar2);
    glVertex3f((float)dVar3 * fVar13,(float)dVar4 * fVar13,fVar15);
    dVar3 = (double)(fVar16 + fVar12);
    dVar4 = cos(dVar3);
    dVar5 = cos(dVar2);
    dVar6 = sin(dVar3);
    dVar2 = sin(dVar2);
    glNormal3f((float)dVar6 * fVar9 + (float)dVar2 * -fVar13,
               -((float)dVar4 * fVar9 + (float)dVar5 * -fVar13),0);
    dVar2 = cos(dVar3);
    dVar4 = sin(dVar3);
    glVertex3f((float)dVar2 * fVar9,(float)dVar4 * fVar9,fVar11);
    dVar2 = cos(dVar3);
    dVar3 = sin(dVar3);
    glVertex3f((float)dVar2 * fVar9,(float)dVar3 * fVar9);
    dVar2 = cos(dVar1);
    dVar1 = sin(dVar1);
    glNormal3f((float)dVar2,(float)dVar1);
  }
  glVertex3f(fVar9,fVar9 * 0.0,fVar11);
  glVertex3f(fVar9,fVar9 * 0.0,fVar15);
  glEnd();
  glShadeModel(0x1d01);
  glBegin(8);
  for (iVar7 = 0; iVar7 <= teeth; iVar7 = iVar7 + 1) {
    dVar1 = (double)((((float)iVar7 + (float)iVar7) * 3.1415927) / fVar10);
    dVar2 = cos(dVar1);
    dVar3 = sin(dVar1);
    glNormal3f(-(float)dVar2,-(float)dVar3,0);
    dVar2 = cos(dVar1);
    dVar3 = sin(dVar1);
    glVertex3f((float)dVar2 * inner_radius,(float)dVar3 * inner_radius,fVar15);
    dVar2 = cos(dVar1);
    dVar1 = sin(dVar1);
    glVertex3f((float)dVar2 * inner_radius,(float)dVar1 * inner_radius);
  }
  glEnd();
  return;
}

Assistant:

static void
gear(GLfloat inner_radius, GLfloat outer_radius, GLfloat width,
  GLint teeth, GLfloat tooth_depth)
{
  GLint i;
  GLfloat r0, r1, r2;
  GLfloat angle, da;
  GLfloat u, v, len;

  r0 = inner_radius;
  r1 = outer_radius - tooth_depth / 2.f;
  r2 = outer_radius + tooth_depth / 2.f;

  da = 2.f * (float) M_PI / teeth / 4.f;

  glShadeModel(GL_FLAT);

  glNormal3f(0.f, 0.f, 1.f);

  /* draw front face */
  glBegin(GL_QUAD_STRIP);
  for (i = 0; i <= teeth; i++) {
    angle = i * 2.f * (float) M_PI / teeth;
    glVertex3f(r0 * (float) cos(angle), r0 * (float) sin(angle), width * 0.5f);
    glVertex3f(r1 * (float) cos(angle), r1 * (float) sin(angle), width * 0.5f);
    if (i < teeth) {
      glVertex3f(r0 * (float) cos(angle), r0 * (float) sin(angle), width * 0.5f);
      glVertex3f(r1 * (float) cos(angle + 3 * da), r1 * (float) sin(angle + 3 * da), width * 0.5f);
    }
  }
  glEnd();

  /* draw front sides of teeth */
  glBegin(GL_QUADS);
  da = 2.f * (float) M_PI / teeth / 4.f;
  for (i = 0; i < teeth; i++) {
    angle = i * 2.f * (float) M_PI / teeth;

    glVertex3f(r1 * (float) cos(angle), r1 * (float) sin(angle), width * 0.5f);
    glVertex3f(r2 * (float) cos(angle + da), r2 * (float) sin(angle + da), width * 0.5f);
    glVertex3f(r2 * (float) cos(angle + 2 * da), r2 * (float) sin(angle + 2 * da), width * 0.5f);
    glVertex3f(r1 * (float) cos(angle + 3 * da), r1 * (float) sin(angle + 3 * da), width * 0.5f);
  }
  glEnd();

  glNormal3f(0.0, 0.0, -1.0);

  /* draw back face */
  glBegin(GL_QUAD_STRIP);
  for (i = 0; i <= teeth; i++) {
    angle = i * 2.f * (float) M_PI / teeth;
    glVertex3f(r1 * (float) cos(angle), r1 * (float) sin(angle), -width * 0.5f);
    glVertex3f(r0 * (float) cos(angle), r0 * (float) sin(angle), -width * 0.5f);
    if (i < teeth) {
      glVertex3f(r1 * (float) cos(angle + 3 * da), r1 * (float) sin(angle + 3 * da), -width * 0.5f);
      glVertex3f(r0 * (float) cos(angle), r0 * (float) sin(angle), -width * 0.5f);
    }
  }
  glEnd();

  /* draw back sides of teeth */
  glBegin(GL_QUADS);
  da = 2.f * (float) M_PI / teeth / 4.f;
  for (i = 0; i < teeth; i++) {
    angle = i * 2.f * (float) M_PI / teeth;

    glVertex3f(r1 * (float) cos(angle + 3 * da), r1 * (float) sin(angle + 3 * da), -width * 0.5f);
    glVertex3f(r2 * (float) cos(angle + 2 * da), r2 * (float) sin(angle + 2 * da), -width * 0.5f);
    glVertex3f(r2 * (float) cos(angle + da), r2 * (float) sin(angle + da), -width * 0.5f);
    glVertex3f(r1 * (float) cos(angle), r1 * (float) sin(angle), -width * 0.5f);
  }
  glEnd();

  /* draw outward faces of teeth */
  glBegin(GL_QUAD_STRIP);
  for (i = 0; i < teeth; i++) {
    angle = i * 2.f * (float) M_PI / teeth;

    glVertex3f(r1 * (float) cos(angle), r1 * (float) sin(angle), width * 0.5f);
    glVertex3f(r1 * (float) cos(angle), r1 * (float) sin(angle), -width * 0.5f);
    u = r2 * (float) cos(angle + da) - r1 * (float) cos(angle);
    v = r2 * (float) sin(angle + da) - r1 * (float) sin(angle);
    len = (float) sqrt(u * u + v * v);
    u /= len;
    v /= len;
    glNormal3f(v, -u, 0.0);
    glVertex3f(r2 * (float) cos(angle + da), r2 * (float) sin(angle + da), width * 0.5f);
    glVertex3f(r2 * (float) cos(angle + da), r2 * (float) sin(angle + da), -width * 0.5f);
    glNormal3f((float) cos(angle), (float) sin(angle), 0.f);
    glVertex3f(r2 * (float) cos(angle + 2 * da), r2 * (float) sin(angle + 2 * da), width * 0.5f);
    glVertex3f(r2 * (float) cos(angle + 2 * da), r2 * (float) sin(angle + 2 * da), -width * 0.5f);
    u = r1 * (float) cos(angle + 3 * da) - r2 * (float) cos(angle + 2 * da);
    v = r1 * (float) sin(angle + 3 * da) - r2 * (float) sin(angle + 2 * da);
    glNormal3f(v, -u, 0.f);
    glVertex3f(r1 * (float) cos(angle + 3 * da), r1 * (float) sin(angle + 3 * da), width * 0.5f);
    glVertex3f(r1 * (float) cos(angle + 3 * da), r1 * (float) sin(angle + 3 * da), -width * 0.5f);
    glNormal3f((float) cos(angle), (float) sin(angle), 0.f);
  }

  glVertex3f(r1 * (float) cos(0), r1 * (float) sin(0), width * 0.5f);
  glVertex3f(r1 * (float) cos(0), r1 * (float) sin(0), -width * 0.5f);

  glEnd();

  glShadeModel(GL_SMOOTH);

  /* draw inside radius cylinder */
  glBegin(GL_QUAD_STRIP);
  for (i = 0; i <= teeth; i++) {
    angle = i * 2.f * (float) M_PI / teeth;
    glNormal3f(-(float) cos(angle), -(float) sin(angle), 0.f);
    glVertex3f(r0 * (float) cos(angle), r0 * (float) sin(angle), -width * 0.5f);
    glVertex3f(r0 * (float) cos(angle), r0 * (float) sin(angle), width * 0.5f);
  }
  glEnd();

}